

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteInlineExports(WatWriter *this,ExternalKind kind,Index index)

{
  Export *this_00;
  string_view str;
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  pVar3;
  Export *export_;
  _Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
  iter;
  _Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
  local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
  iter_pair;
  Index index_local;
  ExternalKind kind_local;
  WatWriter *this_local;
  
  if ((this->options_->inline_export & 1U) != 0) {
    iter_pair.second._M_node._0_4_ = index;
    iter_pair.second._M_node._4_4_ = kind;
    iter._M_node = (_Base_ptr)
                   std::make_pair<wabt::ExternalKind&,unsigned_int&>
                             ((ExternalKind *)((long)&iter_pair.second._M_node + 4),
                              (uint *)&iter_pair.second);
    pVar3 = std::
            multimap<std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*,_std::less<std::pair<wabt::ExternalKind,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>_>
            ::equal_range(&this->inline_export_map_,(key_type *)&iter);
    local_28 = pVar3.first._M_node;
    export_ = (Export *)local_28._M_node;
    while (bVar1 = std::operator!=((_Self *)&export_,&iter_pair.first), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
                             *)&export_);
      this_00 = ppVar2->second;
      WriteOpenSpace(this,"export");
      str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
      ;
      WriteQuotedString(this,str,None);
      WriteCloseSpace(this);
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<wabt::ExternalKind,_unsigned_int>,_const_wabt::Export_*>_>
                    *)&export_);
    }
  }
  return;
}

Assistant:

void WatWriter::WriteInlineExports(ExternalKind kind, Index index) {
  if (!options_.inline_export) {
    return;
  }

  auto iter_pair = inline_export_map_.equal_range(std::make_pair(kind, index));
  for (auto iter = iter_pair.first; iter != iter_pair.second; ++iter) {
    const Export* export_ = iter->second;
    WriteOpenSpace("export");
    WriteQuotedString(export_->name, NextChar::None);
    WriteCloseSpace();
  }
}